

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.cc
# Opt level: O3

BIO * BIO_new(BIO_METHOD *type)

{
  int iVar1;
  BIO *orig_ptr;
  CRYPTO_EX_DATA *ad;
  void *in_RSI;
  
  orig_ptr = (BIO *)OPENSSL_zalloc(0x48);
  if (orig_ptr != (BIO *)0x0) {
    orig_ptr->method = type;
    *(undefined4 *)((long)&orig_ptr->cb_arg + 4) = 1;
    orig_ptr->retry_reason = 1;
    CRYPTO_new_ex_data((int)orig_ptr + 8,in_RSI,ad);
    if (type->create == (_func_600 *)0x0) {
      return orig_ptr;
    }
    iVar1 = (*type->create)(orig_ptr);
    if (iVar1 != 0) {
      return orig_ptr;
    }
    OPENSSL_free(orig_ptr);
  }
  return (BIO *)0x0;
}

Assistant:

BIO *BIO_new(const BIO_METHOD *method) {
  BIO *ret = reinterpret_cast<BIO *>(OPENSSL_zalloc(sizeof(BIO)));
  if (ret == NULL) {
    return NULL;
  }

  ret->method = method;
  ret->shutdown = 1;
  ret->references = 1;
  CRYPTO_new_ex_data(&ret->ex_data);

  if (method->create != NULL && !method->create(ret)) {
    OPENSSL_free(ret);
    return NULL;
  }

  return ret;
}